

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

lws_vhost * lws_select_vhost(lws_context *context,int port,char *servername)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  lws_vhost *plVar4;
  char *pcVar5;
  size_t sVar6;
  lws_vhost *plVar7;
  lws_vhost *plVar8;
  int local_50;
  
  plVar8 = context->vhost_list;
  plVar4 = (lws_vhost *)strlen(servername);
  pcVar5 = strchr(servername,0x3a);
  plVar7 = (lws_vhost *)(pcVar5 + -(long)servername);
  if (pcVar5 == (char *)0x0) {
    plVar7 = plVar4;
  }
  local_50 = (int)plVar7;
  if (plVar8 != (lws_vhost *)0x0) {
    plVar4 = plVar8;
    do {
      if ((plVar4->listen_port == port) &&
         (iVar2 = strncmp(plVar4->name,servername,(long)local_50), iVar2 == 0)) {
        _lws_log(8,"SNI: Found: %s\n",servername);
        return plVar4;
      }
      plVar4 = plVar4->vhost_next;
    } while (plVar4 != (lws_vhost *)0x0);
  }
  do {
    if (plVar8 == (lws_vhost *)0x0) {
      plVar4 = context->vhost_list;
      while( true ) {
        if (plVar4 == (lws_vhost *)0x0) {
          return (lws_vhost *)0x0;
        }
        if ((port != 0) && (plVar4->listen_port == port)) break;
        plVar4 = plVar4->vhost_next;
      }
      _lws_log(8,"%s: vhost match to %s based on port %d\n","lws_select_vhost",plVar4->name,port);
      return plVar4;
    }
    pcVar5 = plVar8->name;
    sVar6 = strlen(pcVar5);
    if ((((port == 0) || (plVar8->listen_port != port)) ||
        (uVar3 = (uint)sVar6, local_50 + -2 < (int)uVar3)) ||
       ((servername[(int)(~uVar3 + local_50)] != '.' ||
        (iVar2 = strncmp(pcVar5,servername + ((long)local_50 - (long)(int)uVar3),(long)(int)uVar3),
        iVar2 != 0)))) {
      plVar8 = plVar8->vhost_next;
      bVar1 = true;
    }
    else {
      bVar1 = false;
      _lws_log(8,"SNI: Found %s on wildcard: %s\n",servername,pcVar5);
      plVar4 = plVar8;
    }
  } while (bVar1);
  return plVar4;
}

Assistant:

struct lws_vhost *
lws_select_vhost(struct lws_context *context, int port, const char *servername)
{
	struct lws_vhost *vhost = context->vhost_list;
	const char *p;
	int n, colon;

	n = (int)strlen(servername);
	colon = n;
	p = strchr(servername, ':');
	if (p)
		colon = lws_ptr_diff(p, servername);

	/* Priotity 1: first try exact matches */

	while (vhost) {
		if (port == vhost->listen_port &&
		    !strncmp(vhost->name, servername, colon)) {
			lwsl_info("SNI: Found: %s\n", servername);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/*
	 * Priority 2: if no exact matches, try matching *.vhost-name
	 * unintentional matches are possible but resolve to x.com for *.x.com
	 * which is reasonable.  If exact match exists we already chose it and
	 * never reach here.  SSL will still fail it if the cert doesn't allow
	 * *.x.com.
	 */
	vhost = context->vhost_list;
	while (vhost) {
		int m = (int)strlen(vhost->name);
		if (port && port == vhost->listen_port &&
		    m <= (colon - 2) &&
		    servername[colon - m - 1] == '.' &&
		    !strncmp(vhost->name, servername + colon - m, m)) {
			lwsl_info("SNI: Found %s on wildcard: %s\n",
				    servername, vhost->name);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* Priority 3: match the first vhost on our port */

	vhost = context->vhost_list;
	while (vhost) {
		if (port && port == vhost->listen_port) {
			lwsl_info("%s: vhost match to %s based on port %d\n",
					__func__, vhost->name, port);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* no match */

	return NULL;
}